

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldDescriptor *in_RDI;
  char *in_stack_00000028;
  Printer *in_stack_00000030;
  Printer *in_stack_00000038;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000040;
  bool in_stack_00000093;
  FieldAccessorType in_stack_00000094;
  FieldDescriptor *in_stack_00000098;
  undefined4 in_stack_000000a0;
  FieldAccessorType in_stack_000000a4;
  FieldDescriptor *in_stack_000000a8;
  Printer *in_stack_000000b0;
  char *in_stack_000001c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001c8;
  Printer *in_stack_000001d0;
  Descriptor *in_stack_ffffffffffffffd8;
  Context *this_00;
  
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  PrintExtraFieldInfo(in_stack_00000040,in_stack_00000038);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0._3_1_);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0._3_1_);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0._3_1_);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportUnknownEnumValue((FileDescriptor *)0x5b9815);
  if (bVar1) {
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000a4,in_stack_000000a0),in_stack_00000098,
               in_stack_00000094,in_stack_00000093);
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000a4,in_stack_000000a0),in_stack_00000098,
               in_stack_00000094,in_stack_00000093);
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  }
  bVar1 = anon_unknown_5::EnableExperimentalRuntimeForLite();
  if ((!bVar1) && (bVar1 = FieldDescriptor::is_packed(in_RDI), bVar1)) {
    this_00 = *(Context **)(in_RDI + 0x40);
    FieldDescriptor::containing_type(*(FieldDescriptor **)(in_RDI + 8));
    bVar1 = Context::HasGeneratedMethods(this_00,in_stack_ffffffffffffffd8);
    if (bVar1) {
      io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    }
  }
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0._3_1_);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0._3_1_);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0._3_1_);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a0._3_1_);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportUnknownEnumValue((FileDescriptor *)0x5b9a29);
  if (bVar1) {
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000a4,in_stack_000000a0),in_stack_00000098,
               in_stack_00000094,in_stack_00000093);
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000a4,in_stack_000000a0),in_stack_00000098,
               in_stack_00000094,in_stack_00000093);
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000a4,in_stack_000000a0),in_stack_00000098,
               in_stack_00000094,in_stack_00000093);
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private com.google.protobuf.Internal.IntList $name$_;\n"
      "private static final "
      "com.google.protobuf.Internal.ListAdapter.Converter<\n"
      "    java.lang.Integer, $type$> $name$_converter_ =\n"
      "        new com.google.protobuf.Internal.ListAdapter.Converter<\n"
      "            java.lang.Integer, $type$>() {\n"
      "          @java.lang.Override\n"
      "          public $type$ convert(java.lang.Integer from) {\n"
      "            $type$ result = $type$.forNumber(from);\n"
      "            return result == null ? $unknown$ : result;\n"
      "          }\n"
      "        };\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.util.List<$type$> "
      "${$get$capitalized_name$List$}$() {\n"
      "  return new com.google.protobuf.Internal.ListAdapter<\n"
      "      java.lang.Integer, $type$>($name$_, $name$_converter_);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $name$_converter_.convert($name$_.getInt(index));\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER);
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.List<java.lang.Integer>\n"
                   "${$get$capitalized_name$ValueList$}$() {\n"
                   "  return $name$_;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_GETTER);
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public int "
                   "${$get$capitalized_name$Value$}$(int index) {\n"
                   "  return $name$_.getInt(index);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  if (!EnableExperimentalRuntimeForLite() && descriptor_->is_packed() &&
      context_->HasGeneratedMethods(descriptor_->containing_type())) {
    printer->Print(variables_, "private int $name$MemoizedSerializedSize;\n");
  }

  // Generate private setters for the builder to proxy into.
  printer->Print(
      variables_,
      "private void ensure$capitalized_name$IsMutable() {\n"
      "  if (!$is_mutable$) {\n"
      "    $name$_ =\n"
      "        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
      "  }\n"
      "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER);
  printer->Print(variables_,
                 "private void set$capitalized_name$(\n"
                 "    int index, $type$ value) {\n"
                 "  if (value == null) {\n"
                 "    throw new NullPointerException();\n"
                 "  }\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.setInt(index, value.getNumber());\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER);
  printer->Print(variables_,
                 "private void add$capitalized_name$($type$ value) {\n"
                 "  if (value == null) {\n"
                 "    throw new NullPointerException();\n"
                 "  }\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.addInt(value.getNumber());\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER);
  printer->Print(variables_,
                 "private void addAll$capitalized_name$(\n"
                 "    java.lang.Iterable<? extends $type$> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  for ($type$ value : values) {\n"
                 "    $name$_.addInt(value.getNumber());\n"
                 "  }\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $name$_ = emptyIntList();\n"
                 "}\n");

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, SETTER);
    printer->Print(variables_,
                   "private void set$capitalized_name$Value(\n"
                   "    int index, int value) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  $name$_.setInt(index, value);\n"
                   "}\n");
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_ADDER);
    printer->Print(variables_,
                   "private void add$capitalized_name$Value(int value) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  $name$_.addInt(value);\n"
                   "}\n");
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_MULTI_ADDER);
    printer->Print(variables_,
                   "private void addAll$capitalized_name$Value(\n"
                   "    java.lang.Iterable<java.lang.Integer> values) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  for (int value : values) {\n"
                   "    $name$_.addInt(value);\n"
                   "  }\n"
                   "}\n");
  }
}